

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::CMP_ID_Y(CPU *this)

{
  uint16_t uVar1;
  int iVar2;
  byte bVar3;
  
  this->cycles = 5;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 1;
  uVar1 = ReadWord(this,(ushort)iVar2 & 0xff);
  this->cycles = this->cycles - 1;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(ushort)(this->Y + uVar1));
  bVar3 = this->A - (byte)iVar2;
  (this->field_6).ps =
       bVar3 & 0x80 | (bVar3 == 0) * '\x02' | (byte)iVar2 <= this->A | (this->field_6).ps & 0x7c;
  return;
}

Assistant:

void CPU::CMP_ID_Y()
{
    cycles = 5;
    uint8_t op = ReadByte(ReadWord((uint16_t)(GetByte())) + Y);
    uint8_t res = A - op;
    C = (A >= op);
    Z = (A == op);
    N = (res & 0b10000000) > 0;
}